

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_poly_vector.h
# Opt level: O0

void __thiscall Impl1::Impl1(Impl1 *this,double dd,bool throw_on_copy)

{
  int *__p;
  bool throw_on_copy_local;
  double dd_local;
  Impl1 *this_local;
  
  Interface::Interface(&this->super_Interface,throw_on_copy);
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR_function_005cb588;
  this->d = dd;
  __p = (int *)operator_new__(0x1bc);
  std::unique_ptr<int[],std::default_delete<int[]>>::
  unique_ptr<int*,std::default_delete<int[]>,void,bool>
            ((unique_ptr<int[],std::default_delete<int[]>> *)&this->p,__p);
  Cookie::Cookie(&this->cookie);
  Cookie::set(&this->cookie);
  return;
}

Assistant:

explicit Impl1(double dd = 0.0, bool throw_on_copy = false)
        : Interface { throw_on_copy }
        , d { dd }
        , p { new int[111] }
    {
        cookie.set();
    }